

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

parse_error * __thiscall
nlohmann::detail::parse_error::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (parse_error *__return_storage_ptr__,parse_error *this,int id_,position_t *pos,
          string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  size_t byte_;
  char *what_arg_00;
  undefined4 in_register_00000014;
  position_t *pos_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *leaf_element;
  string local_168;
  string local_148;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string w;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *context_local;
  string *what_arg_local;
  position_t *pos_local;
  int id__local;
  
  w.field_2._8_8_ = what_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"parse_error",&local_111);
  exception::name(&local_f0,&local_110,(int)this);
  std::operator+(&local_d0,&local_f0,"parse error");
  position_string_abi_cxx11_(&local_148,(parse_error *)CONCAT44(in_register_00000014,id_),pos_00);
  std::operator+(&local_b0,&local_d0,&local_148);
  std::operator+(&local_90,&local_b0,": ");
  exception::
  diagnostics<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_168,(exception *)w.field_2._8_8_,leaf_element);
  std::operator+(&local_70,&local_90,&local_168);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pos)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  byte_ = *(size_t *)&((parse_error *)CONCAT44(in_register_00000014,id_))->super_exception;
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  parse_error(__return_storage_ptr__,(int)this,byte_,what_arg_00);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + exception::diagnostics(context) + what_arg;
        return {id_, pos.chars_read_total, w.c_str()};
    }